

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Osc::renderNoise(V2Osc *this,float *dest,int nsamples)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar7 = (this->nf).l;
  fVar8 = (this->nf).b;
  uVar4 = this->nseed;
  bVar3 = this->ring;
  uVar6 = 0;
  uVar5 = (ulong)(uint)nsamples;
  if (nsamples < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    uVar4 = uVar4 * 0xbb38435 + 0x3619636b;
    uVar1 = this->nffrq;
    uVar2 = this->nfres;
    fVar7 = fVar7 + fVar8 * (float)uVar1;
    fVar9 = ((float)(uVar4 >> 9 | 0x40000000) + -3.0 + -fVar8 * (float)uVar2) - fVar7;
    fVar8 = fVar8 + (float)uVar1 * fVar9;
    fVar9 = ((float)uVar2 * (fVar9 + fVar7) + fVar8) * this->gain;
    if ((bVar3 & 1U) == 0) {
      fVar9 = dest[uVar6] + fVar9;
    }
    else {
      fVar9 = dest[uVar6] * fVar9;
    }
    dest[uVar6] = fVar9;
  }
  this->nseed = uVar4;
  return;
}

Assistant:

void renderNoise(float *dest, int nsamples)
    {
        COVER("Osc noise");

        V2LRC flt = nf;
        uint32_t seed = nseed;

        for (int i=0; i < nsamples; i++)
        {
            // uniform random value (noise)
            float n = frandom(&seed);

            // filter
            float h = flt.step(n, nffrq, nfres);
            float x = nfres*(flt.l + h) + flt.b;

            output(dest + i, gain * x);
        }

        flt = nf;
        nseed = seed;
    }